

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderU.h
# Opt level: O0

void __thiscall
chrono::ChLoaderUdistributed::ChLoaderUdistributed
          (ChLoaderUdistributed *this,shared_ptr<chrono::ChLoadableU> *mloadable)

{
  shared_ptr<chrono::ChLoadableU> local_28;
  shared_ptr<chrono::ChLoadableU> *local_18;
  shared_ptr<chrono::ChLoadableU> *mloadable_local;
  ChLoaderUdistributed *this_local;
  
  local_18 = mloadable;
  mloadable_local = (shared_ptr<chrono::ChLoadableU> *)this;
  std::shared_ptr<chrono::ChLoadableU>::shared_ptr(&local_28,mloadable);
  ChLoaderU::ChLoaderU(&this->super_ChLoaderU,&local_28);
  std::shared_ptr<chrono::ChLoadableU>::~shared_ptr(&local_28);
  (this->super_ChLoaderU).super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUdistributed_001c3e50;
  return;
}

Assistant:

ChLoaderUdistributed(std::shared_ptr<ChLoadableU> mloadable) : ChLoaderU(mloadable) {}